

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

uint32_t __thiscall arith_uint256::GetCompact(arith_uint256 *this,bool fNegative)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined1 in_SIL;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  uint32_t nCompact;
  int nSize;
  arith_uint256 bn;
  base_uint<256U> *in_stack_ffffffffffffff88;
  bool local_69;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  undefined3 in_stack_ffffffffffffffac;
  uint shift;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  shift = CONCAT13(in_SIL,in_stack_ffffffffffffffac) & 0x1ffffff;
  uVar2 = base_uint<256U>::bits
                    ((base_uint<256U> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_58 = uVar2 + 7 >> 3;
  if (local_58 < 4) {
    uVar3 = base_uint<256U>::GetLow64(in_stack_ffffffffffffff88);
    uVar2 = (uint)(uVar3 << (('\x03' - (char)local_58) * '\b' & 0x3fU));
  }
  else {
    ::operator>>(in_RDI,shift);
    arith_uint256((arith_uint256 *)in_stack_ffffffffffffff88,(base_uint<256U> *)0x100e865);
    uVar3 = base_uint<256U>::GetLow64(in_stack_ffffffffffffff88);
    uVar2 = (uint)uVar3;
  }
  if ((uVar2 & 0x800000) != 0) {
    uVar2 = uVar2 >> 8;
    local_58 = local_58 + 1;
  }
  if ((uVar2 & 0xff800000) != 0) {
    __assert_fail("(nCompact & ~0x007fffffU) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/arith_uint256.cpp"
                  ,0xd3,"uint32_t arith_uint256::GetCompact(bool) const");
  }
  if (0xff < local_58) {
    __assert_fail("nSize < 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/arith_uint256.cpp"
                  ,0xd4,"uint32_t arith_uint256::GetCompact(bool) const");
  }
  local_69 = (shift & 0x1000000) != 0 && (uVar2 & 0x7fffff) != 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_58 << 0x18 | uVar2 | (uint)local_69 << 0x17;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t arith_uint256::GetCompact(bool fNegative) const
{
    int nSize = (bits() + 7) / 8;
    uint32_t nCompact = 0;
    if (nSize <= 3) {
        nCompact = GetLow64() << 8 * (3 - nSize);
    } else {
        arith_uint256 bn = *this >> 8 * (nSize - 3);
        nCompact = bn.GetLow64();
    }
    // The 0x00800000 bit denotes the sign.
    // Thus, if it is already set, divide the mantissa by 256 and increase the exponent.
    if (nCompact & 0x00800000) {
        nCompact >>= 8;
        nSize++;
    }
    assert((nCompact & ~0x007fffffU) == 0);
    assert(nSize < 256);
    nCompact |= nSize << 24;
    nCompact |= (fNegative && (nCompact & 0x007fffff) ? 0x00800000 : 0);
    return nCompact;
}